

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderTextureFunctionTests.cpp
# Opt level: O0

void deqp::gles2::Functional::evalTexture2DProj3(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  undefined8 local_28;
  undefined8 local_20;
  TexLookupParams *local_18;
  TexLookupParams *p_local;
  ShaderEvalContext *c_local;
  
  local_18 = p;
  p_local = (TexLookupParams *)c;
  pfVar4 = tcu::Vector<float,_4>::x(c->in);
  fVar1 = *pfVar4;
  pfVar4 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(p_local[1].scale.m_data + 2));
  fVar2 = *pfVar4;
  pfVar4 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(p_local[1].scale.m_data + 2));
  fVar3 = *pfVar4;
  pfVar4 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(p_local[1].scale.m_data + 2));
  texture2D((Functional *)&local_48,c,fVar1 / fVar2,fVar3 / *pfVar4,local_18->lod);
  tcu::operator*((tcu *)&local_38,&local_48,&local_18->scale);
  tcu::operator+((tcu *)&local_28,&local_38,&local_18->bias);
  *(undefined8 *)(p_local[0xd].bias.m_data + 2) = local_28;
  p_local[0xe].lod = (float)(undefined4)local_20;
  p_local[0xe].scale.m_data[0] = (float)local_20._4_4_;
  return;
}

Assistant:

static void		evalTexture2DProj3		(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture2D(c, c.in[0].x()/c.in[0].z(), c.in[0].y()/c.in[0].z(), p.lod)*p.scale + p.bias; }